

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAlgorithms.h
# Opt level: O1

void cmEraseIf<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,(anonymous_namespace)::file_not_persistent>
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *cont,__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      param_2)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  bool bVar2;
  long lVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  iterator __first;
  
  pbVar4 = (cont->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (cont->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  lVar3 = (long)pbVar1 - (long)pbVar4 >> 7;
  if (0 < lVar3) {
    lVar3 = lVar3 + 1;
    do {
      bVar2 = __gnu_cxx::__ops::_Iter_pred<(anonymous_namespace)::file_not_persistent>::operator()
                        ((_Iter_pred<(anonymous_namespace)::file_not_persistent> *)pbVar4,param_2);
      __first._M_current = pbVar4;
      if (bVar2) goto LAB_001c8643;
      bVar2 = __gnu_cxx::__ops::_Iter_pred<(anonymous_namespace)::file_not_persistent>::operator()
                        ((_Iter_pred<(anonymous_namespace)::file_not_persistent> *)(pbVar4 + 1),
                         param_2);
      __first._M_current = pbVar4 + 1;
      if (bVar2) goto LAB_001c8643;
      bVar2 = __gnu_cxx::__ops::_Iter_pred<(anonymous_namespace)::file_not_persistent>::operator()
                        ((_Iter_pred<(anonymous_namespace)::file_not_persistent> *)(pbVar4 + 2),
                         param_2);
      __first._M_current = pbVar4 + 2;
      if (bVar2) goto LAB_001c8643;
      bVar2 = __gnu_cxx::__ops::_Iter_pred<(anonymous_namespace)::file_not_persistent>::operator()
                        ((_Iter_pred<(anonymous_namespace)::file_not_persistent> *)(pbVar4 + 3),
                         param_2);
      __first._M_current = pbVar4 + 3;
      if (bVar2) goto LAB_001c8643;
      pbVar4 = pbVar4 + 4;
      lVar3 = lVar3 + -1;
    } while (1 < lVar3);
  }
  lVar3 = (long)pbVar1 - (long)pbVar4 >> 5;
  if (lVar3 != 1) {
    if (lVar3 != 2) {
      __first._M_current = pbVar1;
      if ((lVar3 != 3) ||
         (bVar2 = __gnu_cxx::__ops::_Iter_pred<(anonymous_namespace)::file_not_persistent>::
                  operator()((_Iter_pred<(anonymous_namespace)::file_not_persistent> *)pbVar4,
                             param_2), __first._M_current = pbVar4, bVar2)) goto LAB_001c8643;
      pbVar4 = pbVar4 + 1;
    }
    bVar2 = __gnu_cxx::__ops::_Iter_pred<(anonymous_namespace)::file_not_persistent>::operator()
                      ((_Iter_pred<(anonymous_namespace)::file_not_persistent> *)pbVar4,param_2);
    __first._M_current = pbVar4;
    if (bVar2) goto LAB_001c8643;
    pbVar4 = pbVar4 + 1;
  }
  bVar2 = __gnu_cxx::__ops::_Iter_pred<(anonymous_namespace)::file_not_persistent>::operator()
                    ((_Iter_pred<(anonymous_namespace)::file_not_persistent> *)pbVar4,param_2);
  __first._M_current = pbVar4;
  if (!bVar2) {
    __first._M_current = pbVar1;
  }
LAB_001c8643:
  pbVar4 = __first._M_current + 1;
  if (pbVar4 != pbVar1 && __first._M_current != pbVar1) {
    do {
      bVar2 = __gnu_cxx::__ops::_Iter_pred<(anonymous_namespace)::file_not_persistent>::operator()
                        ((_Iter_pred<(anonymous_namespace)::file_not_persistent> *)pbVar4,param_2);
      if (!bVar2) {
        param_2._M_current = pbVar4;
        std::__cxx11::string::operator=((string *)__first._M_current,(string *)pbVar4);
        __first._M_current = __first._M_current + 1;
      }
      pbVar4 = pbVar4 + 1;
    } while (pbVar4 != pbVar1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase(cont,__first,
             (cont->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish);
  return;
}

Assistant:

void cmEraseIf(Container& cont, Predicate pred)
{
  cont.erase(std::remove_if(cont.begin(), cont.end(), pred), cont.end());
}